

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O2

void BrotliCreateHqZopfliBackwardReferences
               (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
               size_t ringbuffer_mask,BrotliEncoderParams *params,HasherHandle hasher,
               int *dist_cache,size_t *last_insert_len,Command_conflict *commands,
               size_t *num_commands,size_t *num_literals)

{
  float fVar1;
  ulong max_backward_limit;
  ushort uVar2;
  ushort uVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  undefined4 uVar10;
  void *__dest;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  size_t sVar19;
  ulong uVar20;
  undefined4 *puVar21;
  long lVar22;
  int *data;
  size_t length;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  uint8_t *puVar35;
  bool bVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  ZopfliNode *nodes;
  undefined4 *local_27d0;
  StartPosQueue *local_27c8;
  ulong local_27c0;
  uint local_27a8;
  ulong local_27a0;
  ulong local_2798;
  ulong local_2790;
  ulong local_2788;
  void *local_2778;
  uint local_2768;
  void *local_2760;
  long local_2730;
  long local_2720;
  ulong local_2718;
  ulong local_2708;
  int orig_dist_cache [4];
  ZopfliCostModel model;
  uint32_t histogram_cmd [704];
  uint32_t histogram_literal [256];
  float local_cb8 [256];
  uint32_t histogram_dist [544];
  
  iVar9 = params->lgwin;
  if (num_bytes == 0) {
    local_2760 = (void *)0x0;
    local_2708 = 0;
    local_2778 = (void *)0x0;
    local_2718 = position;
  }
  else {
    local_2708 = num_bytes * 4;
    local_2760 = BrotliAllocate(m,local_2708);
    lVar22 = num_bytes - 0x7f;
    if (num_bytes < 0x7f) {
      lVar22 = 0;
    }
    local_2718 = lVar22 + position;
    if (local_2708 == 0) {
      local_2778 = (void *)0x0;
      local_2708 = 0;
    }
    else {
      local_2778 = BrotliAllocate(m,num_bytes << 5);
    }
  }
  max_backward_limit = (1L << ((byte)iVar9 & 0x3f)) - 0x10;
  lVar18 = 0;
  lVar22 = 0;
  do {
    if (num_bytes <= lVar18 + 3U) {
      sVar4 = *num_literals;
      sVar5 = *last_insert_len;
      uVar7 = *(undefined8 *)dist_cache;
      uVar8 = *(undefined8 *)(dist_cache + 2);
      sVar6 = *num_commands;
      length = num_bytes + 1;
      if (length == 0) {
        local_27c8 = (StartPosQueue *)0x0;
      }
      else {
        local_27c8 = (StartPosQueue *)BrotliAllocate(m,length * 0x10);
      }
      InitZopfliCostModel(m,&model,&params->dist,num_bytes);
      for (lVar22 = 0; lVar22 != 2; lVar22 = lVar22 + 1) {
        BrotliInitZopfliNodes((ZopfliNode *)local_27c8,length);
        if (lVar22 == 0) {
          nodes = (ZopfliNode *)0x118aff;
          ZopfliCostModelSetFromLiteralCosts(&model,position,ringbuffer,ringbuffer_mask);
        }
        else {
          sVar19 = *num_commands;
          memset(histogram_literal,0,0x400);
          memset(histogram_cmd,0,0xb00);
          memset(histogram_dist,0,0x880);
          uVar16 = position - sVar5;
          for (lVar18 = 0; lVar18 != sVar19 - sVar6; lVar18 = lVar18 + 1) {
            uVar30 = commands[lVar18].insert_len_;
            uVar15 = commands[lVar18].copy_len_;
            uVar2 = commands[lVar18].dist_prefix_;
            uVar3 = commands[lVar18].cmd_prefix_;
            histogram_cmd[uVar3] = histogram_cmd[uVar3] + 1;
            if (0x7f < uVar3) {
              histogram_dist[uVar2 & 0x3ff] = histogram_dist[uVar2 & 0x3ff] + 1;
            }
            uVar26 = (ulong)uVar30;
            uVar25 = uVar16;
            while (bVar36 = uVar26 != 0, uVar26 = uVar26 - 1, bVar36) {
              histogram_literal[ringbuffer[uVar25 & ringbuffer_mask]] =
                   histogram_literal[ringbuffer[uVar25 & ringbuffer_mask]] + 1;
              uVar25 = uVar25 + 1;
            }
            uVar16 = uVar16 + uVar30 + (ulong)(uVar15 & 0x1ffffff);
          }
          SetCost(histogram_literal,0x100,1,local_cb8);
          SetCost(histogram_cmd,0x2c0,0,model.cost_cmd_);
          nodes = (ZopfliNode *)0x118a66;
          SetCost(histogram_dist,(ulong)model.distance_histogram_size,0,model.cost_dist_);
          model.min_cost_cmd_ = 1.7e+38;
          for (lVar18 = 0; lVar18 != 0x2c0; lVar18 = lVar18 + 1) {
            if (model.cost_cmd_[lVar18] <= model.min_cost_cmd_) {
              model.min_cost_cmd_ = model.cost_cmd_[lVar18];
            }
          }
          *model.literal_costs_ = 0.0;
          fVar38 = 0.0;
          fVar37 = 0.0;
          for (sVar19 = 0; model.num_bytes_ != sVar19; sVar19 = sVar19 + 1) {
            fVar1 = (float)histogram_dist
                           [(ulong)ringbuffer[position + sVar19 & ringbuffer_mask] - 0x100];
            fVar39 = fVar37 + fVar38 + fVar1;
            model.literal_costs_[sVar19 + 1] = fVar39;
            fVar38 = (fVar38 + fVar1) - (fVar39 - fVar37);
            fVar37 = fVar39;
          }
        }
        *num_commands = sVar6;
        *num_literals = sVar4;
        *last_insert_len = sVar5;
        *(undefined8 *)dist_cache = uVar7;
        *(undefined8 *)(dist_cache + 2) = uVar8;
        uVar30 = 0x145;
        if (params->quality < 0xb) {
          uVar30 = 0x96;
        }
        *(undefined4 *)&local_27c8->q_[0].pos = 0;
        local_27c8->q_[0].distance_cache[1] = 0;
        histogram_cmd[0x40] = 0;
        histogram_cmd[0x41] = 0;
        lVar18 = 0;
        for (sVar19 = 0; sVar19 + 3 < num_bytes; sVar19 = sVar19 + 1) {
          sVar13 = UpdateNodes(num_bytes,position,sVar19,ringbuffer,ringbuffer_mask,params,
                               max_backward_limit,dist_cache,
                               (ulong)*(uint *)((long)local_2760 + sVar19 * 4),
                               (BackwardMatch *)((long)local_2778 + lVar18 * 8),&model,
                               (StartPosQueue *)histogram_cmd,(ZopfliNode *)local_27c8);
          uVar16 = 0;
          if (0x3fff < sVar13) {
            uVar16 = sVar13;
          }
          uVar26 = (ulong)*(uint *)((long)local_2760 + sVar19 * 4);
          lVar18 = lVar18 + uVar26;
          if (((uVar26 == 1) &&
              (uVar15 = *(uint *)((long)local_2778 + lVar18 * 8 + -4) >> 5, uVar30 < uVar15)) &&
             (uVar16 < uVar15)) {
            uVar16 = (ulong)uVar15;
          }
          if (1 < uVar16) {
            while ((uVar16 = uVar16 - 1, uVar16 != 0 &&
                   (uVar26 = sVar19 + 4, sVar19 = sVar19 + 1, uVar26 < num_bytes))) {
              EvaluateNode(position,sVar19,max_backward_limit,(size_t)dist_cache,(int *)&model,
                           (ZopfliCostModel *)histogram_cmd,local_27c8,nodes);
              lVar18 = lVar18 + (ulong)*(uint *)((long)local_2760 + sVar19 * 4);
            }
          }
        }
        sVar19 = ComputeShortestPathFromNodes(num_bytes,(ZopfliNode *)local_27c8);
        *num_commands = *num_commands + sVar19;
        BrotliZopfliCreateCommands
                  (num_bytes,position,max_backward_limit,(ZopfliNode *)local_27c8,dist_cache,
                   last_insert_len,params,commands,num_literals);
      }
      CleanupZopfliCostModel(m,&model);
      BrotliFree(m,local_27c8);
      BrotliFree(m,local_2778);
      BrotliFree(m,local_2760);
      return;
    }
    uVar16 = lVar18 + position;
    uVar26 = max_backward_limit;
    if (uVar16 < max_backward_limit) {
      uVar26 = uVar16;
    }
    uVar25 = lVar22 + 0x80;
    if (local_2708 < uVar25) {
      uVar24 = local_2708;
      if (local_2708 == 0) {
        uVar24 = uVar25;
      }
      do {
        uVar17 = uVar24;
        uVar24 = uVar17 * 2;
      } while (uVar17 < uVar25);
      __dest = BrotliAllocate(m,uVar17 * 8);
      if (local_2708 != 0) {
        memcpy(__dest,local_2778,local_2708 << 3);
      }
      BrotliFree(m,local_2778);
      local_2778 = __dest;
      local_2708 = uVar17;
    }
    uVar24 = num_bytes - lVar18;
    uVar25 = 0x10;
    if (params->quality == 0xb) {
      uVar25 = 0x40;
    }
    puVar21 = (undefined4 *)((long)local_2778 + lVar22 * 8);
    uVar17 = 0;
    if (uVar25 <= uVar16) {
      uVar17 = uVar16 - uVar25;
    }
    data = (int *)(ringbuffer + (uVar16 & ringbuffer_mask));
    uVar25 = uVar16;
    uVar12 = 1;
    local_27d0 = puVar21;
    while (((uVar25 = uVar25 - 1, uVar17 < uVar25 && (uVar12 < 3)) && (uVar16 - uVar25 <= uVar26)))
    {
      uVar28 = uVar25 & ringbuffer_mask;
      if (((uint8_t)*data == ringbuffer[uVar28]) &&
         (*(uint8_t *)((long)data + 1) == ringbuffer[uVar28 + 1])) {
        uVar29 = 0;
        lVar34 = 0;
LAB_00117eae:
        uVar20 = (ulong)((uint)uVar24 & 7);
        uVar27 = uVar24 & 0xfffffffffffffff8;
        if (uVar24 >> 3 == uVar29) {
          for (; (uVar29 = uVar24, uVar20 != 0 &&
                 (uVar29 = uVar27, ringbuffer[uVar27 + uVar28] == *(uint8_t *)((long)data + uVar27))
                 ); uVar27 = uVar27 + 1) {
            uVar20 = uVar20 - 1;
          }
        }
        else {
          if (*(ulong *)(data + uVar29 * 2) == *(ulong *)(ringbuffer + uVar29 * 8 + uVar28))
          goto code_r0x00117ec0;
          uVar29 = *(ulong *)(ringbuffer + uVar29 * 8 + uVar28) ^ *(ulong *)(data + uVar29 * 2);
          uVar28 = 0;
          if (uVar29 != 0) {
            for (; (uVar29 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
            }
          }
          uVar29 = (uVar28 >> 3 & 0x1fffffff) - lVar34;
        }
        if (uVar12 < uVar29) {
          *local_27d0 = (int)(uVar16 - uVar25);
          local_27d0[1] = (int)uVar29 << 5;
          local_27d0 = local_27d0 + 2;
          uVar12 = uVar29;
        }
      }
    }
    uVar30 = (uint)ringbuffer_mask;
    if (uVar12 < uVar24) {
      uVar17 = (ulong)((uint)(*data * 0x1e35a7bd) >> 0xf);
      uVar15 = *(uint *)(hasher + uVar17 * 4 + 0x30);
      uVar25 = uVar24;
      if (0x7f < uVar24) {
        *(int *)(hasher + uVar17 * 4 + 0x30) = (int)uVar16;
        uVar25 = 0x80;
      }
      uVar17 = *(ulong *)(hasher + 0x28);
      uVar28 = uVar17 & uVar16;
      local_2720 = uVar28 * 2 + 1;
      local_2730 = uVar28 * 2;
      local_2788 = 0;
      local_2798 = 0;
      lVar34 = 0x40;
      while (uVar28 = uVar16 - uVar15, uVar28 != 0) {
        bVar36 = lVar34 == 0;
        lVar34 = lVar34 + -1;
        if ((uVar26 < uVar28) || (bVar36)) break;
        uVar29 = local_2798;
        if (local_2788 < local_2798) {
          uVar29 = local_2788;
        }
        lVar11 = uVar29 + (uVar15 & uVar30);
        uVar33 = uVar24 - uVar29;
        uVar27 = uVar33 & 0xfffffffffffffff8;
        uVar20 = 0;
        lVar31 = 0;
LAB_00118034:
        if (uVar33 >> 3 == uVar20) {
          uVar23 = (ulong)((uint)uVar33 & 7);
          puVar35 = ringbuffer + (lVar11 - lVar31);
          for (; (bVar36 = uVar23 != 0, uVar23 = uVar23 - 1, uVar20 = uVar33, bVar36 &&
                 (uVar20 = uVar27, *(uint8_t *)((long)data + uVar27 + uVar29) == *puVar35));
              uVar27 = uVar27 + 1) {
            puVar35 = puVar35 + 1;
          }
        }
        else {
          uVar23 = *(ulong *)((long)data + uVar20 * 8 + uVar29);
          if (*(ulong *)(ringbuffer + uVar20 * 8 + lVar11) == uVar23) goto code_r0x00118050;
          uVar23 = uVar23 ^ *(ulong *)(ringbuffer + uVar20 * 8 + lVar11);
          uVar20 = 0;
          if (uVar23 != 0) {
            for (; (uVar23 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
            }
          }
          uVar20 = (uVar20 >> 3 & 0x1fffffff) - lVar31;
        }
        uVar20 = uVar20 + uVar29;
        if (local_27d0 == (undefined4 *)0x0) {
          local_27d0 = (undefined4 *)0x0;
        }
        else if (uVar12 < uVar20) {
          *local_27d0 = (int)uVar28;
          local_27d0[1] = (int)uVar20 << 5;
          local_27d0 = local_27d0 + 2;
          uVar12 = uVar20;
        }
        uVar14 = (uint)uVar17;
        if (uVar25 <= uVar20) {
          if (uVar24 < 0x80) goto LAB_00118219;
          *(undefined4 *)(hasher + local_2730 * 4 + 0x80038) =
               *(undefined4 *)(hasher + (ulong)(uVar14 & uVar15) * 8 + 0x80038);
          uVar10 = *(undefined4 *)(hasher + (ulong)(uVar14 & uVar15) * 8 + 0x8003c);
          goto LAB_001181fe;
        }
        if (ringbuffer[uVar20 + (uVar15 & uVar30)] < *(byte *)((long)data + uVar20)) {
          if (0x7f < uVar24) {
            *(uint *)(hasher + local_2730 * 4 + 0x80038) = uVar15;
          }
          lVar11 = (ulong)(uVar15 & uVar14) * 2 + 1;
          local_2788 = uVar20;
          local_2730 = lVar11;
        }
        else {
          if (0x7f < uVar24) {
            *(uint *)(hasher + local_2720 * 4 + 0x80038) = uVar15;
          }
          lVar11 = (ulong)(uVar15 & uVar14) * 2;
          local_2798 = uVar20;
          local_2720 = lVar11;
        }
        uVar15 = *(uint *)(hasher + lVar11 * 4 + 0x80038);
      }
      if (0x7f < uVar24) {
        uVar10 = *(undefined4 *)(hasher + 0x80030);
        *(undefined4 *)(hasher + local_2730 * 4 + 0x80038) = uVar10;
LAB_001181fe:
        *(undefined4 *)(hasher + local_2720 * 4 + 0x80038) = uVar10;
      }
    }
LAB_00118219:
    for (lVar34 = 0; lVar34 != 0x26; lVar34 = lVar34 + 1) {
      histogram_cmd[lVar34] = 0xfffffff;
    }
    uVar25 = uVar12 + 1;
    if (uVar12 + 1 < 5) {
      uVar25 = 4;
    }
    iVar9 = BrotliFindAllStaticDictionaryMatches
                      (&params->dictionary,(uint8_t *)data,uVar25,uVar24,histogram_cmd);
    if (iVar9 != 0) {
      if (0x24 < uVar24) {
        uVar24 = 0x25;
      }
      iVar9 = (int)uVar25 << 5;
      for (; uVar25 <= uVar24; uVar25 = uVar25 + 1) {
        uVar15 = histogram_cmd[uVar25];
        if ((uVar15 < 0xfffffff) &&
           (uVar17 = (ulong)(uVar15 >> 5) + uVar26 + 1, uVar17 <= (params->dist).max_distance)) {
          uVar15 = uVar15 & 0x1f;
          *local_27d0 = (int)uVar17;
          if (uVar25 == uVar15) {
            uVar15 = 0;
          }
          local_27d0[1] = uVar15 + iVar9;
          local_27d0 = local_27d0 + 2;
        }
        iVar9 = iVar9 + 0x20;
      }
    }
    lVar11 = (long)local_27d0 - (long)puVar21 >> 3;
    *(int *)((long)local_2760 + lVar18 * 4) = (int)lVar11;
    lVar34 = lVar22;
    if (local_27d0 != puVar21) {
      lVar34 = lVar11 + lVar22;
      uVar15 = *(uint *)((long)local_2778 + lVar34 * 8 + -4);
      if (0x28bf < uVar15) {
        uVar24 = (ulong)(uVar15 >> 5);
        *(undefined8 *)((long)local_2778 + lVar22 * 8) =
             *(undefined8 *)((long)local_2778 + lVar34 * 8 + -8);
        uVar26 = uVar16 + 1;
        uVar25 = uVar24 + uVar16;
        lVar34 = uVar24 - 1;
        if (local_2718 <= uVar25) {
          uVar25 = local_2718;
        }
        uVar24 = uVar25 - 0x3f;
        if (uVar25 < uVar16 + 0x40) {
          uVar24 = uVar26;
        }
        *(undefined4 *)((long)local_2760 + lVar18 * 4) = 1;
        if (uVar16 + 0x201 <= uVar24) {
          for (; uVar26 < uVar24; uVar26 = uVar26 + 8) {
            uVar16 = *(ulong *)(hasher + 0x28);
            uVar12 = uVar26 & ringbuffer_mask;
            uVar17 = (ulong)((uint)(*(int *)(ringbuffer + uVar12) * 0x1e35a7bd) >> 0xf);
            uVar15 = *(uint *)(hasher + uVar17 * 4 + 0x30);
            local_27c0 = (uVar16 & uVar26) * 2 + 1;
            local_2798 = (uVar16 & uVar26) * 2;
            *(int *)(hasher + uVar17 * 4 + 0x30) = (int)uVar26;
            local_27d0 = (undefined4 *)0x0;
            uVar17 = 0;
            lVar11 = 0x40;
            while (uVar26 != uVar15) {
              bVar36 = lVar11 == 0;
              lVar11 = lVar11 + -1;
              if ((uVar16 - 0xf < uVar26 - uVar15) || (bVar36)) break;
              puVar21 = (undefined4 *)uVar17;
              if (local_27d0 < uVar17) {
                puVar21 = local_27d0;
              }
              lVar31 = (long)puVar21 + (ulong)(uVar15 & uVar30);
              uVar20 = 0x80 - (long)puVar21;
              uVar28 = uVar20 & 0xfffffffffffffff8;
              uVar29 = 0;
              lVar32 = 0;
LAB_0011848c:
              if (uVar20 >> 3 == uVar29) {
                uVar27 = (ulong)((uint)uVar20 & 7);
                puVar35 = ringbuffer + (lVar31 - lVar32);
                for (; (bVar36 = uVar27 != 0, uVar27 = uVar27 - 1, uVar29 = uVar20, bVar36 &&
                       (uVar29 = uVar28, ringbuffer[uVar28 + (long)puVar21 + uVar12] == *puVar35));
                    uVar28 = uVar28 + 1) {
                  puVar35 = puVar35 + 1;
                }
              }
              else {
                if (*(ulong *)(ringbuffer + uVar29 * 8 + lVar31) ==
                    *(ulong *)(ringbuffer + uVar29 * 8 + (long)puVar21 + uVar12))
                goto code_r0x001184a8;
                uVar29 = *(ulong *)(ringbuffer + uVar29 * 8 + (long)puVar21 + uVar12) ^
                         *(ulong *)(ringbuffer + uVar29 * 8 + lVar31);
                uVar28 = 0;
                if (uVar29 != 0) {
                  for (; (uVar29 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                uVar29 = (uVar28 >> 3 & 0x1fffffff) - lVar32;
              }
              uVar29 = uVar29 + (long)puVar21;
              local_2768 = (uint)uVar16;
              if (0x7f < uVar29) {
                *(undefined4 *)(hasher + local_2798 * 4 + 0x80038) =
                     *(undefined4 *)(hasher + (ulong)(local_2768 & uVar15) * 8 + 0x80038);
                uVar10 = *(undefined4 *)(hasher + (ulong)(local_2768 & uVar15) * 8 + 0x8003c);
                goto LAB_001185dd;
              }
              uVar28 = (ulong)(uVar15 & local_2768) * 2;
              if (ringbuffer[uVar29 + (uVar15 & uVar30)] < ringbuffer[uVar29 + uVar12]) {
                *(uint *)(hasher + local_2798 * 4 + 0x80038) = uVar15;
                uVar28 = uVar28 | 1;
                local_27d0 = (undefined4 *)uVar29;
                local_2798 = uVar28;
              }
              else {
                *(uint *)(hasher + local_27c0 * 4 + 0x80038) = uVar15;
                uVar17 = uVar29;
                local_27c0 = uVar28;
              }
              uVar15 = *(uint *)(hasher + uVar28 * 4 + 0x80038);
            }
            uVar10 = *(undefined4 *)(hasher + 0x80030);
            *(undefined4 *)(hasher + local_2798 * 4 + 0x80038) = uVar10;
LAB_001185dd:
            *(undefined4 *)(hasher + local_27c0 * 4 + 0x80038) = uVar10;
          }
        }
        for (; uVar24 < uVar25; uVar24 = uVar24 + 1) {
          uVar16 = *(ulong *)(hasher + 0x28);
          uVar17 = uVar24 & ringbuffer_mask;
          uVar26 = (ulong)((uint)(*(int *)(ringbuffer + uVar17) * 0x1e35a7bd) >> 0xf);
          uVar15 = *(uint *)(hasher + uVar26 * 4 + 0x30);
          local_2790 = (uVar16 & uVar24) * 2 + 1;
          local_27c0 = (uVar16 & uVar24) * 2;
          *(int *)(hasher + uVar26 * 4 + 0x30) = (int)uVar24;
          local_27a0 = 0;
          uVar26 = 0;
          lVar11 = 0x40;
          while (uVar24 != uVar15) {
            bVar36 = lVar11 == 0;
            lVar11 = lVar11 + -1;
            if ((uVar16 - 0xf < uVar24 - uVar15) || (bVar36)) break;
            uVar12 = uVar26;
            if (local_27a0 < uVar26) {
              uVar12 = local_27a0;
            }
            lVar31 = uVar12 + (uVar15 & uVar30);
            uVar28 = 0x80 - uVar12;
            uVar20 = uVar28 & 0xfffffffffffffff8;
            uVar29 = 0;
            lVar32 = 0;
LAB_001186c3:
            if (uVar28 >> 3 == uVar29) {
              uVar27 = (ulong)((uint)uVar28 & 7);
              puVar35 = ringbuffer + (lVar31 - lVar32);
              for (; (bVar36 = uVar27 != 0, uVar27 = uVar27 - 1, uVar29 = uVar28, bVar36 &&
                     (uVar29 = uVar20, ringbuffer[uVar20 + uVar12 + uVar17] == *puVar35));
                  uVar20 = uVar20 + 1) {
                puVar35 = puVar35 + 1;
              }
            }
            else {
              if (*(ulong *)(ringbuffer + uVar29 * 8 + lVar31) ==
                  *(ulong *)(ringbuffer + uVar29 * 8 + uVar12 + uVar17)) goto code_r0x001186d9;
              uVar29 = *(ulong *)(ringbuffer + uVar29 * 8 + uVar12 + uVar17) ^
                       *(ulong *)(ringbuffer + uVar29 * 8 + lVar31);
              uVar28 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                }
              }
              uVar29 = (uVar28 >> 3 & 0x1fffffff) - lVar32;
            }
            uVar29 = uVar29 + uVar12;
            local_27a8 = (uint)uVar16;
            if (0x7f < uVar29) {
              *(undefined4 *)(hasher + local_27c0 * 4 + 0x80038) =
                   *(undefined4 *)(hasher + (ulong)(local_27a8 & uVar15) * 8 + 0x80038);
              uVar10 = *(undefined4 *)(hasher + (ulong)(local_27a8 & uVar15) * 8 + 0x8003c);
              goto LAB_001187e4;
            }
            uVar12 = (ulong)(uVar15 & local_27a8) * 2;
            if (ringbuffer[uVar29 + (uVar15 & uVar30)] < ringbuffer[uVar29 + uVar17]) {
              *(uint *)(hasher + local_27c0 * 4 + 0x80038) = uVar15;
              uVar12 = uVar12 | 1;
              local_27c0 = uVar12;
              local_27a0 = uVar29;
            }
            else {
              *(uint *)(hasher + local_2790 * 4 + 0x80038) = uVar15;
              uVar26 = uVar29;
              local_2790 = uVar12;
            }
            uVar15 = *(uint *)(hasher + uVar12 * 4 + 0x80038);
          }
          uVar10 = *(undefined4 *)(hasher + 0x80030);
          *(undefined4 *)(hasher + local_27c0 * 4 + 0x80038) = uVar10;
LAB_001187e4:
          *(undefined4 *)(hasher + local_2790 * 4 + 0x80038) = uVar10;
        }
        memset((void *)((long)local_2760 + lVar18 * 4 + 4),0,lVar34 * 4);
        lVar18 = lVar18 + lVar34;
        lVar34 = lVar22 + 1;
      }
    }
    lVar18 = lVar18 + 1;
    lVar22 = lVar34;
  } while( true );
code_r0x00118050:
  lVar31 = lVar31 + -8;
  uVar20 = uVar20 + 1;
  goto LAB_00118034;
code_r0x001184a8:
  lVar32 = lVar32 + -8;
  uVar29 = uVar29 + 1;
  goto LAB_0011848c;
code_r0x001186d9:
  lVar32 = lVar32 + -8;
  uVar29 = uVar29 + 1;
  goto LAB_001186c3;
code_r0x00117ec0:
  lVar34 = lVar34 + -8;
  uVar29 = uVar29 + 1;
  goto LAB_00117eae;
}

Assistant:

void BrotliCreateHqZopfliBackwardReferences(MemoryManager* m,
    size_t num_bytes, size_t position, const uint8_t* ringbuffer,
    size_t ringbuffer_mask, const BrotliEncoderParams* params,
    HasherHandle hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  uint32_t* num_matches = BROTLI_ALLOC(m, uint32_t, num_bytes);
  size_t matches_size = 4 * num_bytes;
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t cur_match_pos = 0;
  size_t i;
  size_t orig_num_literals;
  size_t orig_last_insert_len;
  int orig_dist_cache[4];
  size_t orig_num_commands;
  ZopfliCostModel model;
  ZopfliNode* nodes;
  BackwardMatch* matches = BROTLI_ALLOC(m, BackwardMatch, matches_size);
  size_t gap = 0;
  size_t shadow_matches = 0;
  if (BROTLI_IS_OOM(m)) return;
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; ++i) {
    const size_t pos = position + i;
    size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    size_t max_length = num_bytes - i;
    size_t num_found_matches;
    size_t cur_match_end;
    size_t j;
    /* Ensure that we have enough free slots. */
    BROTLI_ENSURE_CAPACITY(m, BackwardMatch, matches, matches_size,
        cur_match_pos + MAX_NUM_MATCHES_H10 + shadow_matches);
    if (BROTLI_IS_OOM(m)) return;
    num_found_matches = FindAllMatchesH10(hasher,
        &params->dictionary, ringbuffer, ringbuffer_mask, pos, max_length,
        max_distance, gap, params, &matches[cur_match_pos + shadow_matches]);
    cur_match_end = cur_match_pos + num_found_matches;
    for (j = cur_match_pos; j + 1 < cur_match_end; ++j) {
      BROTLI_DCHECK(BackwardMatchLength(&matches[j]) <=
          BackwardMatchLength(&matches[j + 1]));
    }
    num_matches[i] = (uint32_t)num_found_matches;
    if (num_found_matches > 0) {
      const size_t match_len = BackwardMatchLength(&matches[cur_match_end - 1]);
      if (match_len > MAX_ZOPFLI_LEN_QUALITY_11) {
        const size_t skip = match_len - 1;
        matches[cur_match_pos++] = matches[cur_match_end - 1];
        num_matches[i] = 1;
        /* Add the tail of the copy to the hasher. */
        StoreRangeH10(hasher, ringbuffer, ringbuffer_mask, pos + 1,
                      BROTLI_MIN(size_t, pos + match_len, store_end));
        memset(&num_matches[i + 1], 0, skip * sizeof(num_matches[0]));
        i += skip;
      } else {
        cur_match_pos = cur_match_end;
      }
    }
  }
  orig_num_literals = *num_literals;
  orig_last_insert_len = *last_insert_len;
  memcpy(orig_dist_cache, dist_cache, 4 * sizeof(dist_cache[0]));
  orig_num_commands = *num_commands;
  nodes = BROTLI_ALLOC(m, ZopfliNode, num_bytes + 1);
  if (BROTLI_IS_OOM(m)) return;
  InitZopfliCostModel(m, &model, &params->dist, num_bytes);
  if (BROTLI_IS_OOM(m)) return;
  for (i = 0; i < 2; i++) {
    BrotliInitZopfliNodes(nodes, num_bytes + 1);
    if (i == 0) {
      ZopfliCostModelSetFromLiteralCosts(
          &model, position, ringbuffer, ringbuffer_mask);
    } else {
      ZopfliCostModelSetFromCommands(&model, position, ringbuffer,
          ringbuffer_mask, commands, *num_commands - orig_num_commands,
          orig_last_insert_len);
    }
    *num_commands = orig_num_commands;
    *num_literals = orig_num_literals;
    *last_insert_len = orig_last_insert_len;
    memcpy(dist_cache, orig_dist_cache, 4 * sizeof(dist_cache[0]));
    *num_commands += ZopfliIterate(num_bytes, position, ringbuffer,
        ringbuffer_mask, params, max_backward_limit, gap, dist_cache,
        &model, num_matches, matches, nodes);
    BrotliZopfliCreateCommands(num_bytes, position, max_backward_limit,
        nodes, dist_cache, last_insert_len, params, commands, num_literals);
  }
  CleanupZopfliCostModel(m, &model);
  BROTLI_FREE(m, nodes);
  BROTLI_FREE(m, matches);
  BROTLI_FREE(m, num_matches);
}